

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  int iVar1;
  ulong uVar2;
  string doubleDash;
  allocator local_71;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"--","");
  if (1 < argc) {
    uVar2 = 1;
    do {
      iVar1 = std::__cxx11::string::compare((char *)local_70);
      if (iVar1 == 0) break;
      std::__cxx11::string::string((string *)&local_50,argv[uVar2],&local_71);
      parseIntoTokens(this,&local_50,tokens);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            const std::string doubleDash = "--";
            for( int i = 1; i < argc && argv[i] != doubleDash; ++i )
                parseIntoTokens( argv[i] , tokens);
        }